

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O3

bool __thiscall
PruneReplayer::enqueue_create_graphics_pipeline
          (PruneReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined7 extraout_var;
  const_iterator cVar4;
  iterator iVar5;
  mapped_type *ppVVar6;
  uint uVar7;
  VkBaseInStructure *sin;
  ulong uVar8;
  int *piVar9;
  uint uVar10;
  long lVar11;
  key_type local_50;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  Hash local_38;
  
  *pipeline = (VkPipeline)hash;
  local_38 = hash;
  bVar1 = filter_object(this,RESOURCE_GRAPHICS_PIPELINE,hash);
  if (bVar1) {
    if (create_info->stageCount == 0) {
      uVar3 = 1;
    }
    else {
      lVar11 = 0x18;
      uVar8 = 0;
      do {
        bVar1 = filter_shader_module(this,*(Hash *)((long)&create_info->pStages->sType + lVar11));
        if (bVar1) {
          uVar2 = (undefined4)CONCAT71(extraout_var,1);
          goto LAB_00112eb0;
        }
        uVar8 = uVar8 + 1;
        lVar11 = lVar11 + 0x30;
      } while (uVar8 < create_info->stageCount);
      uVar2 = 0;
LAB_00112eb0:
      uVar3 = 1;
      if ((ulong)create_info->stageCount != 0) {
        local_48 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)CONCAT44(local_48._4_4_,uVar2);
        lVar11 = 0x18;
        uVar8 = 0;
        do {
          local_50 = *(key_type *)((long)&create_info->pStages->sType + lVar11);
          cVar4 = std::
                  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&(this->banned_modules)._M_h,&local_50);
          if (cVar4.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
            uVar3 = 0;
            goto LAB_00112f01;
          }
          uVar8 = uVar8 + 1;
          lVar11 = lVar11 + 0x30;
        } while (uVar8 < create_info->stageCount);
        uVar3 = (uint)local_48;
      }
    }
LAB_00112f01:
    for (piVar9 = (int *)create_info->pNext; uVar7 = uVar3, piVar9 != (int *)0x0;
        piVar9 = *(int **)(piVar9 + 2)) {
      if (*piVar9 == 0x3b9f36d0) {
        if (piVar9[4] != 0) {
          local_48 = &(this->banned_graphics)._M_h;
          local_40 = &(this->graphics_pipelines)._M_h;
          uVar8 = 0;
          uVar10 = 0;
          goto LAB_00112f49;
        }
        uVar10 = 0;
        goto LAB_00112fbe;
      }
    }
    goto LAB_00112fd1;
  }
  uVar3 = create_info->flags & 0x800;
  goto LAB_00112ff2;
  while( true ) {
    if (uVar10 == 0) {
      local_50 = *(key_type *)(*(long *)(piVar9 + 6) + uVar8 * 8);
      iVar5 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_40,&local_50);
      if ((iVar5.
           super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
           ._M_cur != (__node_type *)0x0) &&
         (*(int *)(*(long *)((long)iVar5.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
                                   ._M_cur + 0x10) + 0x14) != 0)) {
        uVar10 = 1;
      }
    }
    uVar8 = uVar8 + 1;
    if ((uint)piVar9[4] <= uVar8) break;
LAB_00112f49:
    local_50 = *(key_type *)(*(long *)(piVar9 + 6) + uVar8 * 8);
    cVar4 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(local_48,&local_50);
    if (cVar4.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
      uVar3 = 0;
      break;
    }
  }
LAB_00112fbe:
  uVar7 = uVar3;
  if ((create_info->stageCount == 0) && (uVar7 = uVar10, (char)uVar3 == '\0')) {
    uVar7 = uVar3 & 0xff;
  }
LAB_00112fd1:
  uVar3 = create_info->flags & 0x800;
  if ((uVar3 != 0) && (uVar7 = uVar7 & 0xff, create_info->stageCount == 0)) {
    uVar7 = 0;
  }
  lVar11 = 0x430;
  if ((uVar7 & 1) != 0) goto LAB_00112ffb;
LAB_00112ff2:
  lVar11 = 0x4a0;
  if (uVar3 == 0) {
    return true;
  }
LAB_00112ffb:
  ppVVar6 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)((long)&(this->super_StateCreatorInterface)._vptr_StateCreatorInterface
                            + lVar11),&local_38);
  *ppVVar6 = create_info;
  return true;
}

Assistant:

bool enqueue_create_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);
		bool allow_pipeline = false;

		if (filter_object(RESOURCE_GRAPHICS_PIPELINE, hash))
		{
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (filter_shader_module((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = true;
					break;
				}
			}

			if (create_info->stageCount == 0)
				allow_pipeline = true;

			// Need to test this as well, if there is at least one banned module used, we don't allow the pipeline.
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (banned_modules.count((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = false;
					break;
				}
			}

			auto *library_info =
					find_pnext<VkPipelineLibraryCreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR,
					                                           create_info->pNext);

			if (library_info)
			{
				bool has_default_allowed_library = false;
				for (uint32_t i = 0; i < library_info->libraryCount; i++)
				{
					if (banned_graphics.count((Hash) library_info->pLibraries[i]))
					{
						allow_pipeline = false;
						break;
					}

					if (!has_default_allowed_library)
					{
						// Only consider libraries which contain modules.
						auto itr = graphics_pipelines.find((Hash) library_info->pLibraries[i]);
						if (itr != graphics_pipelines.end() && itr->second->stageCount != 0)
							has_default_allowed_library = true;
					}
				}

				// At least one of the dependent libraries must be considered allowed to pass.
				if (create_info->stageCount == 0 && allow_pipeline)
					allow_pipeline = has_default_allowed_library;
			}

			// Never include libraries by default unless they contain real code.
			if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 && create_info->stageCount == 0)
				allow_pipeline = false;
		}

		// Need to defer this since we need to access pipeline libraries.
		if (allow_pipeline)
			graphics_pipelines[hash] = create_info;
		else if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0)
			library_graphics_pipelines[hash] = create_info;

		return true;
	}